

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QXmlStreamAttribute>::resize(QList<QXmlStreamAttribute> *this,qsizetype size)

{
  Data *pDVar1;
  QXmlStreamAttribute *pQVar2;
  long lVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (pQVar2 = (this->d).ptr,
     ((long)((long)pQVar2 -
            ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
     -0x4ec4ec4ec4ec4ec5 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QXmlStreamAttribute>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QXmlStreamAttribute **)0x0,
               (QArrayDataPointer<QXmlStreamAttribute> *)0x0);
    lVar3 = (this->d).size;
  }
  else {
    lVar3 = (this->d).size;
    if (size < lVar3) {
      std::_Destroy_aux<false>::__destroy<QXmlStreamAttribute*>(pQVar2 + size,pQVar2 + lVar3);
      goto LAB_0039bec0;
    }
  }
  if (size <= lVar3) {
    return;
  }
  pQVar2 = (this->d).ptr;
  std::__uninitialized_default_1<false>::__uninit_default<QXmlStreamAttribute*>
            (pQVar2 + lVar3,pQVar2 + size);
LAB_0039bec0:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }